

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

void lzham::vector<lzham::lzcompressor::lzdecision>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  int iVar1;
  lzdecision *pDst;
  lzdecision *pSrc_end;
  lzdecision *pSrc;
  uint num_local;
  void *pSrc_void_local;
  void *pDst_void_local;
  
  pDst = (lzdecision *)pDst_void;
  for (pSrc = (lzdecision *)pSrc_void; pSrc != (lzdecision *)((long)pSrc_void + (ulong)num * 0xc);
      pSrc = pSrc + 1) {
    iVar1 = pSrc->m_len;
    pDst->m_pos = pSrc->m_pos;
    pDst->m_len = iVar1;
    pDst->m_dist = pSrc->m_dist;
    pDst = pDst + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            pSrc++;
            pDst++;
         }
      }